

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O3

void ecs_set_component_actions_w_entity
               (ecs_world_t *world,ecs_entity_t component,EcsComponentLifecycle *lifecycle)

{
  ecs_xtor_t p_Var1;
  ecs_copy_t p_Var2;
  ecs_move_t p_Var3;
  int *piVar4;
  ecs_c_info_t *peVar5;
  ecs_table_event_t local_40;
  
  piVar4 = (int *)ecs_get_w_entity(world,component,1);
  _ecs_assert(piVar4 != (int *)0x0,2,(char *)0x0,"component_ptr != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x166);
  if (piVar4 == (int *)0x0) {
    __assert_fail("component_ptr != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x166,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  _ecs_assert(*piVar4 != 0,2,(char *)0x0,"component_ptr->size != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x169);
  if (*piVar4 == 0) {
    __assert_fail("component_ptr->size != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x169,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  peVar5 = ecs_get_or_create_c_info(world,component);
  _ecs_assert(peVar5 != (ecs_c_info_t *)0x0,0xc,(char *)0x0,"c_info != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x16d);
  if (peVar5 == (ecs_c_info_t *)0x0) {
    __assert_fail("c_info != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x16d,
                  "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                 );
  }
  if (peVar5->lifecycle_set == true) {
    _ecs_assert(peVar5->component == component,0xc,(char *)0x0,"c_info->component == component",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x170);
    if (peVar5->component != component) {
      __assert_fail("c_info->component == component",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x170,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((peVar5->lifecycle).ctor == lifecycle->ctor,0x31,(char *)0x0,
                "c_info->lifecycle.ctor == lifecycle->ctor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x172);
    if ((peVar5->lifecycle).ctor != lifecycle->ctor) {
      __assert_fail("c_info->lifecycle.ctor == lifecycle->ctor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x172,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((peVar5->lifecycle).dtor == lifecycle->dtor,0x31,(char *)0x0,
                "c_info->lifecycle.dtor == lifecycle->dtor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x174);
    if ((peVar5->lifecycle).dtor != lifecycle->dtor) {
      __assert_fail("c_info->lifecycle.dtor == lifecycle->dtor",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x174,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((peVar5->lifecycle).copy == lifecycle->copy,0x31,(char *)0x0,
                "c_info->lifecycle.copy == lifecycle->copy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x176);
    if ((peVar5->lifecycle).copy != lifecycle->copy) {
      __assert_fail("c_info->lifecycle.copy == lifecycle->copy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x176,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
    _ecs_assert((peVar5->lifecycle).move == lifecycle->move,0x31,(char *)0x0,
                "c_info->lifecycle.move == lifecycle->move",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x178);
    if ((peVar5->lifecycle).move != lifecycle->move) {
      __assert_fail("c_info->lifecycle.move == lifecycle->move",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/world.c"
                    ,0x178,
                    "void ecs_set_component_actions_w_entity(ecs_world_t *, ecs_entity_t, EcsComponentLifecycle *)"
                   );
    }
  }
  else {
    peVar5->component = component;
    p_Var1 = lifecycle->dtor;
    p_Var2 = lifecycle->copy;
    p_Var3 = lifecycle->move;
    (peVar5->lifecycle).ctor = lifecycle->ctor;
    (peVar5->lifecycle).dtor = p_Var1;
    (peVar5->lifecycle).copy = p_Var2;
    (peVar5->lifecycle).move = p_Var3;
    (peVar5->lifecycle).ctx = lifecycle->ctx;
    peVar5->lifecycle_set = true;
    if ((lifecycle->ctor == (ecs_xtor_t)0x0) &&
       (((lifecycle->dtor != (ecs_xtor_t)0x0 || (lifecycle->copy != (ecs_copy_t)0x0)) ||
        (lifecycle->move != (ecs_move_t)0x0)))) {
      (peVar5->lifecycle).ctor = ctor_init_zero;
    }
    local_40.kind = EcsTableComponentInfo;
    local_40.query = (ecs_query_t *)0x0;
    local_40.matched_table_index = 0;
    local_40.component = component;
    ecs_notify_tables(world,&local_40);
  }
  return;
}

Assistant:

void ecs_set_component_actions_w_entity(
    ecs_world_t *world,
    ecs_entity_t component,
    EcsComponentLifecycle *lifecycle)
{
#ifndef NDEBUG
    const EcsComponent *component_ptr = ecs_get(world, component, EcsComponent);

    /* Cannot register lifecycle actions for things that aren't a component */
    ecs_assert(component_ptr != NULL, ECS_INVALID_PARAMETER, NULL);

    /* Cannot register lifecycle actions for components with size 0 */
    ecs_assert(component_ptr->size != 0, ECS_INVALID_PARAMETER, NULL);
#endif

    ecs_c_info_t *c_info = ecs_get_or_create_c_info(world, component);
    ecs_assert(c_info != NULL, ECS_INTERNAL_ERROR, NULL);

    if (c_info->lifecycle_set) {
        ecs_assert(c_info->component == component, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(c_info->lifecycle.ctor == lifecycle->ctor, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.dtor == lifecycle->dtor, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.copy == lifecycle->copy, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
        ecs_assert(c_info->lifecycle.move == lifecycle->move, 
            ECS_INCONSISTENT_COMPONENT_ACTION, NULL);
    } else {
        c_info->component = component;
        c_info->lifecycle = *lifecycle;
        c_info->lifecycle_set = true;

        /* If no constructor is set, invoking any of the other lifecycle actions 
         * is not safe as they will potentially access uninitialized memory. For 
         * ease of use, if no constructor is specified, set a default one that 
         * initializes the component to 0. */
        if (!lifecycle->ctor && (lifecycle->dtor || lifecycle->copy || lifecycle->move)) {
            c_info->lifecycle.ctor = ctor_init_zero;   
        }

        ecs_notify_tables(world, &(ecs_table_event_t) {
            .kind = EcsTableComponentInfo,
            .component = component
        });
    }
}